

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

bool __thiscall psy::C::TypeChecker::isAssignable(TypeChecker *this,SyntaxNode *node,Type *ty)

{
  pointer ppMVar1;
  TypeKind TVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TagDeclarationSymbol *this_00;
  undefined4 extraout_var_01;
  SyntaxToken *this_01;
  pointer ppMVar5;
  Members local_b0;
  SyntaxToken local_98;
  SyntaxToken local_60;
  
  while (TVar2 = Type::kind(ty), TVar2 == TypedefName) {
    iVar4 = (*ty->_vptr_Type[0xb])(ty);
    ty = TypedefNameType::resolvedSynonymizedType((TypedefNameType *)CONCAT44(extraout_var,iVar4));
  }
  if (TVar2 == Array) {
    SyntaxNode::lastToken(&local_98,node);
    DiagnosticsReporter::CannotAssignToExpressionOfArrayType(&this->diagReporter_,&local_98);
    this_01 = &local_98;
  }
  else {
    if (TVar2 == Tag) {
      iVar4 = (*ty->_vptr_Type[0xd])(ty);
      this_00 = TagType::declaration((TagType *)CONCAT44(extraout_var_00,iVar4));
      if (this_00 == (TagDeclarationSymbol *)0x0) {
        return false;
      }
      TagDeclarationSymbol::members(&local_b0,this_00);
      ppMVar1 = local_b0.
                super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_b0.
          super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_b0.
          super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = true;
      }
      else {
        do {
          ppMVar5 = ppMVar1 + 1;
          iVar4 = (*((*ppMVar1)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x26])();
          bVar3 = isAssignable(this,node,(Type *)CONCAT44(extraout_var_01,iVar4));
          ppMVar1 = ppMVar5;
        } while (bVar3 && ppMVar5 !=
                          local_b0.
                          super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_b0.
          super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.
                        super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        return bVar3;
      }
      return bVar3;
    }
    if (TVar2 != Qualified) {
      return true;
    }
    SyntaxNode::lastToken(&local_60,node);
    DiagnosticsReporter::CannotAssignToExpressionOfConstQualifiedType
              (&this->diagReporter_,&local_60);
    this_01 = &local_60;
  }
  SyntaxToken::~SyntaxToken(this_01);
  return false;
}

Assistant:

bool TypeChecker::isAssignable(const SyntaxNode* node, const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Qualified:
            diagReporter_.CannotAssignToExpressionOfConstQualifiedType(node->lastToken());
            return false;
        case TypeKind::TypedefName:
            return isAssignable(node, ty->asTypedefNameType()->resolvedSynonymizedType());
        case TypeKind::Array:
            diagReporter_.CannotAssignToExpressionOfArrayType(node->lastToken());
            return false;
        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            auto tagTyDecl = tagTy->declaration();
            if (!tagTyDecl)
                return false;
            for (const auto& membDecl : tagTyDecl->members()) {
                auto membTy = membDecl->type();
                if (!isAssignable(node, membTy))
                    return false;
            }
            return true;
        }
        default:
            return true;
    }
}